

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O1

void extent_hook_post_reentrancy(tsdn_t *tsdn)

{
  int8_t *piVar1;
  char *in_FS_OFFSET;
  
  if ((tsdn == (tsdn_t *)0x0) && (tsdn = *(tsdn_t **)in_FS_OFFSET, *in_FS_OFFSET != '\0')) {
    tsdn = (tsdn_t *)tsd_fetch_slow(&tsdn->tsd,false);
  }
  piVar1 = &(tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_reentrancy_level;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != '\0') {
    return;
  }
  tsd_slow_update(&tsdn->tsd);
  return;
}

Assistant:

static void
extent_hook_post_reentrancy(tsdn_t *tsdn) {
	tsd_t *tsd = tsdn_null(tsdn) ? tsd_fetch() : tsdn_tsd(tsdn);
	post_reentrancy(tsd);
}